

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O1

int Aig_ManAddNewCnfToSolver
              (sat_solver *pSat,Aig_Man_t *pAig,Vec_Int_t *vNode2Var,Vec_Int_t *vPioIds,
              Vec_Ptr_t *vPartPos,int fAlignPol)

{
  byte *pbVar1;
  lit *begin;
  lit *end;
  void *pvVar2;
  Aig_Man_t *pAVar3;
  int iVar4;
  Cnf_Dat_t *pCVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int Lits [2];
  uint local_78;
  int local_74;
  Vec_Int_t *local_70;
  Cnf_Dat_t *local_68;
  sat_solver *local_60;
  int local_54;
  Vec_Ptr_t *local_50;
  Vec_Int_t *local_48;
  Aig_Man_t *local_40;
  void *local_38;
  
  local_70 = vNode2Var;
  local_54 = fAlignPol;
  local_50 = vPartPos;
  pCVar5 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Cnf_DataTranformPolarity(pCVar5,1);
  iVar4 = sat_solver_nvars(pSat);
  Cnf_DataLift(pCVar5,iVar4);
  iVar4 = sat_solver_nvars(pSat);
  local_68 = pCVar5;
  sat_solver_setnvars(pSat,iVar4 + pCVar5->nVars);
  lVar10 = 0;
  while (lVar10 < local_68->nClauses) {
    begin = local_68->pClauses[lVar10];
    if ((begin == (lit *)0x0) || (end = local_68->pClauses[lVar10 + 1], end == (lit *)0x0)) break;
    iVar4 = sat_solver_addclause(pSat,begin,end);
    lVar10 = lVar10 + 1;
    if (iVar4 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                    ,0x18b,
                    "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                   );
    }
  }
  pVVar6 = pAig->vCis;
  local_60 = pSat;
  local_48 = vPioIds;
  local_40 = pAig;
  if (0 < pVVar6->nSize) {
    lVar10 = 0;
    do {
      pSat = local_60;
      if (vPioIds->nSize <= lVar10) goto LAB_006c28f5;
      lVar8 = (long)vPioIds->pArray[lVar10];
      if ((lVar8 < 0) || (local_70->nSize <= vPioIds->pArray[lVar10])) goto LAB_006c28f5;
      pvVar2 = pVVar6->pArray[lVar10];
      iVar4 = local_70->pArray[lVar8];
      if (iVar4 == 0) {
        local_70->pArray[lVar8] = local_68->pVarNums[*(int *)((long)pvVar2 + 0x24)];
      }
      else {
        uVar7 = iVar4 * 2;
        local_74 = local_68->pVarNums[*(int *)((long)pvVar2 + 0x24)] * 2 + 1;
        local_78 = uVar7;
        iVar4 = sat_solver_addclause(local_60,(lit *)&local_78,(lit *)&local_70);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                        ,0x19d,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
        local_78 = uVar7 | 1;
        local_74 = local_68->pVarNums[*(int *)((long)pvVar2 + 0x24)] * 2;
        iVar4 = sat_solver_addclause(pSat,(lit *)&local_78,(lit *)&local_70);
        vPioIds = local_48;
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                        ,0x1a1,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
      }
      lVar10 = lVar10 + 1;
      pVVar6 = local_40->vCis;
    } while (lVar10 < pVVar6->nSize);
  }
  pCVar5 = local_68;
  pVVar6 = local_40->vCos;
  if (0 < pVVar6->nSize) {
    lVar10 = 0;
    do {
      pSat = local_60;
      uVar9 = (ulong)(uint)local_40->nObjs[2] + lVar10;
      iVar4 = (int)uVar9;
      if ((iVar4 < 0) || (vPioIds->nSize <= iVar4)) goto LAB_006c28f5;
      lVar8 = (long)vPioIds->pArray[uVar9 & 0xffffffff];
      if ((lVar8 < 0) || (local_70->nSize <= vPioIds->pArray[uVar9 & 0xffffffff]))
      goto LAB_006c28f5;
      pvVar2 = pVVar6->pArray[lVar10];
      iVar4 = local_70->pArray[lVar8];
      if (iVar4 == 0) {
        local_70->pArray[lVar8] = local_68->pVarNums[*(int *)((long)pvVar2 + 0x24)];
      }
      else {
        uVar7 = iVar4 * 2;
        local_74 = pCVar5->pVarNums[*(int *)((long)pvVar2 + 0x24)] * 2 + 1;
        local_78 = uVar7;
        local_38 = pvVar2;
        iVar4 = sat_solver_addclause(local_60,(lit *)&local_78,(lit *)&local_70);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                        ,0x1b2,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
        local_78 = uVar7 | 1;
        local_74 = pCVar5->pVarNums[*(int *)((long)local_38 + 0x24)] * 2;
        iVar4 = sat_solver_addclause(pSat,(lit *)&local_78,(lit *)&local_70);
        vPioIds = local_48;
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                        ,0x1b6,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
      }
      lVar10 = lVar10 + 1;
      pVVar6 = local_40->vCos;
    } while (lVar10 < pVVar6->nSize);
  }
  pAVar3 = local_40;
  if (0 < local_70->nSize) {
    if (*local_70->pArray == 0) {
      *local_70->pArray = *local_68->pVarNums;
    }
    Cnf_DataFree(local_68);
    if (0 < local_50->nSize) {
      lVar10 = 0;
      do {
        uVar9 = *(ulong *)((long)local_50->pArray[lVar10] + 8);
        if (uVar9 == 0) {
          uVar7 = 0xffffffff;
        }
        else {
          uVar7 = *(uint *)((uVar9 & 0xfffffffffffffffe) + 0x24);
        }
        if (((int)uVar7 < 0) || (local_70->nSize <= (int)uVar7)) goto LAB_006c28f5;
        if (local_70->pArray[uVar7] == 0) {
          __assert_fail("iSatVarOld != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                        ,0x1c2,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
        local_78 = ((uint)uVar9 & 1) + local_70->pArray[uVar7] * 2;
        if ((local_54 != 0) && ((*(byte *)((uVar9 & 0xfffffffffffffffe) + 0x18) & 8) != 0)) {
          local_78 = local_78 ^ 1;
        }
        iVar4 = sat_solver_addclause(pSat,(lit *)&local_78,&local_74);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                        ,0x1ca,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < local_50->nSize);
    }
    pVVar6 = pAVar3->vCis;
    if (0 < pVVar6->nSize) {
      lVar10 = 0;
      do {
        pvVar2 = pVVar6->pArray[lVar10];
        uVar9 = *(ulong *)((long)pvVar2 + 0x18);
        if ((uVar9 & 0x30) != 0) {
          if (vPioIds->nSize <= lVar10) goto LAB_006c28f5;
          iVar4 = vPioIds->pArray[lVar10];
          if (((long)iVar4 < 0) || (local_70->nSize <= iVar4)) goto LAB_006c28f5;
          local_78 = ((uint)(uVar9 >> 4) & 1) + local_70->pArray[iVar4] * 2;
          iVar4 = sat_solver_addclause(pSat,(lit *)&local_78,&local_74);
          if (iVar4 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                          ,0x1d8,
                          "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                         );
          }
          pbVar1 = (byte *)((long)pvVar2 + 0x18);
          *pbVar1 = *pbVar1 & 0xcf;
        }
        lVar10 = lVar10 + 1;
        pVVar6 = pAVar3->vCis;
      } while (lVar10 < pVVar6->nSize);
    }
    return 0;
  }
LAB_006c28f5:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Aig_ManAddNewCnfToSolver( sat_solver * pSat, Aig_Man_t * pAig, Vec_Int_t * vNode2Var, 
                             Vec_Int_t * vPioIds, Vec_Ptr_t * vPartPos, int fAlignPol )
{
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int * pBeg, * pEnd;
    int i, Lits[2], iSatVarOld, iNodeIdOld;
    // derive CNF and express it using new SAT variables
    pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    Cnf_DataTranformPolarity( pCnf, 1 );
    Cnf_DataLift( pCnf, sat_solver_nvars(pSat) );
    // create new variables in the SAT solver
    sat_solver_setnvars( pSat, sat_solver_nvars(pSat) + pCnf->nVars );
    // add clauses for this CNF
    Cnf_CnfForClause( pCnf, pBeg, pEnd, i )
        if ( !sat_solver_addclause( pSat, pBeg, pEnd ) )
        {
            assert( 0 ); // if it happens, can return 1 (unsatisfiable)
            return 1;
        }
    // derive the connector clauses
    Aig_ManForEachCi( pAig, pObj, i )
    {
        iNodeIdOld = Vec_IntEntry( vPioIds, i );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        if ( iSatVarOld == 0 ) // iNodeIdOld in the original AIG has no SAT var
        { 
            // map the corresponding original AIG node into this SAT var
            Vec_IntWriteEntry( vNode2Var, iNodeIdOld, pCnf->pVarNums[Aig_ObjId(pObj)] );
            continue;
        }
        // add connector clauses 
        Lits[0] = toLitCond( iSatVarOld, 0 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( iSatVarOld, 1 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    // derive the connector clauses
    Aig_ManForEachCo( pAig, pObj, i )
    {
        iNodeIdOld = Vec_IntEntry( vPioIds, Aig_ManCiNum(pAig) + i );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        if ( iSatVarOld == 0 ) // iNodeIdOld in the original AIG has no SAT var
        { 
            // map the corresponding original AIG node into this SAT var
            Vec_IntWriteEntry( vNode2Var, iNodeIdOld, pCnf->pVarNums[Aig_ObjId(pObj)] );
            continue;
        }
        // add connector clauses 
        Lits[0] = toLitCond( iSatVarOld, 0 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( iSatVarOld, 1 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    // transfer the ID of constant 1 node
    if ( Vec_IntEntry( vNode2Var, 0 ) == 0 )
        Vec_IntWriteEntry( vNode2Var, 0, pCnf->pVarNums[0] );
    // remove the CNF
    Cnf_DataFree( pCnf );
    // constrain the solver with the literals corresponding to the original POs
    Vec_PtrForEachEntry( Aig_Obj_t *, vPartPos, pObj, i )
    {
        iNodeIdOld = Aig_ObjFaninId0( pObj );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        assert( iSatVarOld != 0 );
        // assert the original PO to be 1
        Lits[0] = toLitCond( iSatVarOld, Aig_ObjFaninC0(pObj) );
        // correct the polarity if polarity alignment is enabled
        if ( fAlignPol && Aig_ObjFanin0(pObj)->fPhase ) 
            Lits[0] = lit_neg( Lits[0] );
        if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
        {
            assert( 0 ); // if it happens, can return 1 (unsatisfiable)
            return 1;
        }
    }
    // constrain some the primary inputs to constant values
    Aig_ManForEachCi( pAig, pObj, i )
    {
        if ( !pObj->fMarkA && !pObj->fMarkB )
            continue;
        iNodeIdOld = Vec_IntEntry( vPioIds, i );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        Lits[0] = toLitCond( iSatVarOld, pObj->fMarkA );
        if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
        {
            assert( 0 ); // if it happens, can return 1 (unsatisfiable)
            return 1;
        }
        pObj->fMarkA = pObj->fMarkB = 0;
    }
    return 0;
}